

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O1

Vec_Int_t * Saig_ManComputeSwitchProbs(Aig_Man_t *pAig,int nFrames,int nPref,int fProbOne)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Gia_Man_t *pGia;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  pGia = Gia_ManFromAigSwitch(pAig);
  __ptr = Gia_ManComputeSwitchProbs(pGia,nFrames,nPref,fProbOne);
  pVVar2 = pAig->vObjs;
  iVar1 = pVVar2->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar6 = 0;
    do {
      if (ppvVar3[lVar6] != (void *)0x0) {
        uVar7 = *(uint *)((long)ppvVar3[lVar6] + 0x28);
        if ((int)uVar7 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar7 = uVar7 >> 1;
        if (__ptr->nSize <= (int)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (iVar1 <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar6] = __ptr->pArray[uVar7];
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  Gia_ManStop(pGia);
  return pVVar4;
}

Assistant:

Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * pAig, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching, * vResult;
    Gia_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // translate AIG into the intermediate form (takes care of choices if present!)
    p = Gia_ManFromAigSwitch( pAig );
    // perform the computation of switching activity
    vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    // transfer the computed result to the original AIG
    vResult = Vec_IntStart( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( Aig_ObjIsCo(pObj) )
//            printf( "%d=%f\n", i, Abc_Int2Float( Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) ) );
        Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) );
    }
    // delete intermediate results
    Vec_IntFree( vSwitching );
    Gia_ManStop( p );
    return vResult;
}